

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

void __thiscall QStandardItemPrivate::setModel(QStandardItemPrivate *this,QStandardItemModel *mod)

{
  QStandardItemModel *pQVar1;
  QModelIndex *pQVar2;
  parameter_type t;
  value_type item;
  int i;
  ulong uVar3;
  QStandardItemPrivate *pQVar4;
  long in_FS_OFFSET;
  QModelIndex local_60;
  Data *local_48;
  QStandardItem **ppQStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->children).d.size == 0) {
    pQVar1 = (QStandardItemModel *)this->model;
    if (pQVar1 != (QStandardItemModel *)0x0) {
      pQVar2 = *(QModelIndex **)(pQVar1 + 8);
      QStandardItemModel::indexFromItem((QModelIndex *)&local_48,pQVar1,this->q_ptr);
      QAbstractItemModelPrivate::invalidatePersistentIndex(pQVar2);
    }
    this->model = mod;
  }
  else {
    local_48 = (Data *)0x0;
    ppQStack_40 = (QStandardItem **)0x0;
    local_38.ptr = (QAbstractItemModel *)0x0;
    QStack<QStandardItem_*>::push((QStack<QStandardItem_*> *)&local_48,&this->q_ptr);
    while (local_38.ptr != (QAbstractItemModel *)0x0) {
      item = QList<QStandardItem_*>::takeLast((QList<QStandardItem_*> *)&local_48);
      pQVar4 = (item->d_ptr).d;
      pQVar1 = (QStandardItemModel *)pQVar4->model;
      if (pQVar1 != (QStandardItemModel *)0x0) {
        pQVar2 = *(QModelIndex **)(pQVar1 + 8);
        QStandardItemModel::indexFromItem(&local_60,pQVar1,item);
        QAbstractItemModelPrivate::invalidatePersistentIndex(pQVar2);
        pQVar4 = (item->d_ptr).d;
      }
      pQVar4->model = mod;
      for (uVar3 = 0; uVar3 < (ulong)(pQVar4->children).d.size; uVar3 = uVar3 + 1) {
        t = (pQVar4->children).d.ptr[uVar3];
        if (t != (parameter_type)0x0) {
          QList<QStandardItem_*>::append((QList<QStandardItem_*> *)&local_48,t);
        }
      }
    }
    QArrayDataPointer<QStandardItem_*>::~QArrayDataPointer
              ((QArrayDataPointer<QStandardItem_*> *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemPrivate::setModel(QStandardItemModel *mod)
{
    if (children.isEmpty()) {
        if (model)
            model->d_func()->invalidatePersistentIndex(model->indexFromItem(q_ptr));
        model = mod;
    } else {
        QStack<QStandardItem*> stack;
        stack.push(q_ptr);
        while (!stack.isEmpty()) {
            QStandardItem *itm = stack.pop();
            if (itm->d_func()->model) {
                itm->d_func()->model->d_func()->invalidatePersistentIndex(itm->d_func()->model->indexFromItem(itm));
            }
            itm->d_func()->model = mod;
            const QList<QStandardItem*> &childList = itm->d_func()->children;
            for (int i = 0; i < childList.size(); ++i) {
                QStandardItem *chi = childList.at(i);
                if (chi)
                    stack.push(chi);
            }
        }
    }
}